

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_push_table(nk_window *win,nk_table *tbl)

{
  nk_table *tbl_local;
  nk_window *win_local;
  
  if (win->tables == (nk_table *)0x0) {
    win->tables = tbl;
    tbl->next = (nk_table *)0x0;
    tbl->prev = (nk_table *)0x0;
    tbl->size = 0;
    win->table_count = 1;
  }
  else {
    win->tables->prev = tbl;
    tbl->next = win->tables;
    tbl->prev = (nk_table *)0x0;
    tbl->size = 0;
    win->tables = tbl;
    win->table_count = win->table_count + 1;
  }
  return;
}

Assistant:

NK_LIB void
nk_push_table(struct nk_window *win, struct nk_table *tbl)
{
    if (!win->tables) {
        win->tables = tbl;
        tbl->next = 0;
        tbl->prev = 0;
        tbl->size = 0;
        win->table_count = 1;
        return;
    }
    win->tables->prev = tbl;
    tbl->next = win->tables;
    tbl->prev = 0;
    tbl->size = 0;
    win->tables = tbl;
    win->table_count++;
}